

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O0

int nni_plat_file_lock(char *path,nni_plat_flock *lk)

{
  int __fd;
  int iVar1;
  int *piVar2;
  int rv_1;
  int rv;
  int fd;
  nni_plat_flock *lk_local;
  char *path_local;
  
  __fd = open(path,0x42,0x180);
  if (__fd < 0) {
    piVar2 = __errno_location();
    path_local._4_4_ = nni_plat_errno(*piVar2);
  }
  else {
    iVar1 = lockf(__fd,2,0);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      close(__fd);
      if (iVar1 == 0xb) {
        path_local._4_4_ = 4;
      }
      else {
        path_local._4_4_ = nni_plat_errno(iVar1);
      }
    }
    else {
      lk->fd = __fd;
      path_local._4_4_ = 0;
    }
  }
  return path_local._4_4_;
}

Assistant:

int
nni_plat_file_lock(const char *path, nni_plat_flock *lk)
{
	int fd;
	int rv;
	if ((fd = open(path, O_RDWR | O_CREAT, S_IRUSR | S_IWUSR)) < 0) {
		return (nni_plat_errno(errno));
	}
#ifdef NNG_HAVE_LOCKF
	rv = lockf(fd, F_TLOCK, 0);
#elif defined NNG_HAVE_FLOCK
	rv = flock(fd, LOCK_EX | LOCK_NB);
#else
	// We don't have locking support.  This means you live dangerously.
	// For example, ZeroTier cannot be sure that nothing else is using
	// the same configuration file.  If you're here, its probably an
	// embedded scenario, and we can live with it.
	rv = 0;
#endif
	if (rv < 0) {
		int rv = errno;
		close(fd);
		if (rv == EAGAIN) {
			return (NNG_EBUSY);
		}
		return (nni_plat_errno(rv));
	}
	lk->fd = fd;
	return (0);
}